

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<Expression,_std::default_delete<Expression>_> __thiscall
Parser::parseUnaryExpression(Parser *this)

{
  TokenType TVar1;
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  const_iterator cVar2;
  CalculationEngine *this_01;
  long *plVar3;
  undefined8 extraout_RAX;
  pointer pTVar4;
  long *plVar5;
  Parser *in_RSI;
  Parser *this_02;
  OperatorChar op;
  unique_ptr<Expression,_std::default_delete<Expression>_> operand;
  OperatorChar local_8c;
  pointer local_88;
  _Head_base<0UL,_Expression_*,_false> local_80;
  pointer local_78;
  pointer local_70;
  pointer local_68;
  pointer pTStack_60;
  string local_58;
  string local_38;
  
  TVar1 = Token::type(&in_RSI->mCurrentToken);
  if (TVar1 == OPERATOR) {
    local_8c = anon_unknown.dwarf_8a29f::tokenAsOperator(&in_RSI->mCurrentToken);
    nextToken(in_RSI);
    parseUnaryExpression((Parser *)&local_88);
    if (local_88 == (pointer)0x0) {
      this->mCalcEngine = (CalculationEngine *)0x0;
      local_88 = (pointer)0x0;
    }
    else {
      this_00 = &CalculationEngine::unaryOperators(in_RSI->mCalcEngine)->_M_h;
      cVar2 = std::
              _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(this_00,&local_8c);
      if (cVar2.super__Node_iterator_base<std::pair<const_OperatorChar,_Operator>,_true>._M_cur ==
          (__node_type *)0x0) {
        OperatorChar::toString_abi_cxx11_(&local_38,&local_8c);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x13a265);
        local_78 = (pointer)*plVar3;
        pTVar4 = (pointer)(plVar3 + 2);
        if (local_78 == pTVar4) {
          local_68 = *(pointer *)pTVar4;
          pTStack_60 = (pointer)plVar3[3];
          local_78 = (pointer)&local_68;
        }
        else {
          local_68 = *(pointer *)pTVar4;
        }
        local_70 = (pointer)plVar3[1];
        this_02 = (Parser *)&local_78;
        *plVar3 = (long)pTVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)this_02);
        local_58._M_dataplus._M_p = (pointer)*plVar3;
        plVar5 = plVar3 + 2;
        if ((long *)local_58._M_dataplus._M_p == plVar5) {
          local_58.field_2._M_allocated_capacity = *plVar5;
          local_58.field_2._8_8_ = plVar3[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *plVar5;
        }
        local_58._M_string_length = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        parseError(this_02,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          (ulong)(local_58.field_2._M_allocated_capacity + 1));
        }
        if (local_78 != (pointer)&local_68) {
          operator_delete(local_78,(ulong)&local_68->field_0x1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if (local_88 != (pointer)0x0) {
          (**(code **)(*(long *)local_88 + 8))();
        }
        _Unwind_Resume(extraout_RAX);
      }
      this_01 = (CalculationEngine *)operator_new(0x18);
      local_80._M_head_impl = (Expression *)local_88;
      local_88 = (pointer)0x0;
      UnaryOperatorExpression::UnaryOperatorExpression
                ((UnaryOperatorExpression *)this_01,local_8c,
                 (unique_ptr<Expression,_std::default_delete<Expression>_> *)&local_80);
      this->mCalcEngine = this_01;
      if ((pointer)local_80._M_head_impl != (pointer)0x0) {
        (*(local_80._M_head_impl)->_vptr_Expression[1])();
      }
      local_80._M_head_impl = (Expression *)0x0;
    }
    if (local_88 != (pointer)0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  else {
    parsePrimaryExpression(this);
  }
  return (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)
         (__uniq_ptr_data<Expression,_std::default_delete<Expression>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expression> Parser::parseUnaryExpression() {
	//If the current token isn't an operator, is must be a primary expression
	if (mCurrentToken.type() != TokenType::OPERATOR) {
		return parsePrimaryExpression();
	}

	//If this is a unary operator, read it.
	auto op = tokenAsOperator(mCurrentToken);
	nextToken(); //Eat the operator

	auto operand = parseUnaryExpression();

	if (operand != nullptr) {
		if (mCalcEngine.unaryOperators().count(op) == 0) {
			parseError("'" + op.toString() + "' is not a defined unary operator.");
		}

		return std::unique_ptr<UnaryOperatorExpression>(
			new UnaryOperatorExpression(op, std::move(operand)));
	}

	return operand;
}